

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# round_trip_wl.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  char *pcVar2;
  ostream *poVar3;
  int iVar4;
  bool bVar5;
  allocator<char> local_2921;
  uint local_2920;
  uint local_291c;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  result;
  Histogram<unsigned_int> histogram;
  WangLandauSampler sampler;
  string local_2880;
  string local_2860;
  string local_2840;
  string local_2820;
  FixedDegreeNetwork network;
  Random rng;
  
  pcVar2 = getenv("BLOCKS");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "BLOCKS not defined";
  }
  else {
    uVar1 = atoi(pcVar2);
    pcVar2 = getenv("ROUND_TRIPS");
    if (pcVar2 != (char *)0x0) {
      local_2920 = atoi(pcVar2);
      FixedDegreeNetwork::FixedDegreeNetwork(&network,3,uVar1);
      Histogram<unsigned_int>::Histogram
                (&histogram,0,network.super_Network.total_triangles / 3,
                 network.super_Network.total_triangles / 3);
      Random::Random(&rng,2);
      WangLandauSampler::WangLandauSampler(&sampler,&rng,&histogram,&network.super_Network);
      while (2 < network.super_Network.total_triangles) {
        WangLandauSampler::markov_step(&sampler);
      }
      result.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      result.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      result.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_291c = uVar1;
      for (iVar4 = 0; iVar4 != 0xf; iVar4 = iVar4 + 1) {
        Histogram<unsigned_int>::reset(&histogram);
        uVar1 = local_2920;
        while (bVar5 = uVar1 != 0, uVar1 = uVar1 - 1, bVar5) {
          WangLandauSampler::perform_round_trip(&sampler);
        }
        sampler.f = sampler.f * 0.5;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2860,"wl_B%d_S%d.dat",&local_2921);
        format(&local_2820,&local_2860,(ulong)local_291c,(ulong)local_2920);
        WangLandauSampler::export_entropy(&sampler,&local_2820);
        std::__cxx11::string::~string((string *)&local_2820);
        std::__cxx11::string::~string((string *)&local_2860);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2880,"results/histogram_wl_B%d_S%d.dat",&local_2921);
        format(&local_2840,&local_2880,(ulong)local_291c,(ulong)local_2920);
        Histogram<unsigned_int>::export_histogram(&histogram,&local_2840);
        std::__cxx11::string::~string((string *)&local_2840);
        std::__cxx11::string::~string((string *)&local_2880);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&result);
      WangLandauSampler::~WangLandauSampler(&sampler);
      std::random_device::~random_device(&rng.rd);
      Histogram<unsigned_int>::~Histogram(&histogram);
      Network::~Network(&network.super_Network);
      return 0;
    }
    pcVar2 = "ROUND_TRIPS not defined";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

int main() {
    char *env_blocks = getenv("BLOCKS");
    if (env_blocks == NULL) {std::cout << "BLOCKS not defined" << std::endl; exit(1);}
    unsigned int blocks = (unsigned int)atoi(env_blocks);

    char *env_round_trips = getenv("ROUND_TRIPS");
    if (env_round_trips == NULL) {std::cout << "ROUND_TRIPS not defined" << std::endl; exit(1);}
    unsigned int round_trips = (unsigned int)atoi(env_round_trips);

    unsigned int total_wl_steps = 15;

    FixedDegreeNetwork network(3, blocks);

    Histogram<unsigned int> histogram(0, network.get_triangles(), network.get_triangles());
    Random rng(2);

    WangLandauSampler sampler(rng, histogram, network);

    // warm up
    while (network.get_triangles() != 0)
        sampler.markov_step();

    std::vector<std::vector<double> > result;

    for (unsigned int step = 0; step < total_wl_steps; step++) {
        histogram.reset();

        double mean_round_trip = 0;
        double std_round_trip = 0;
        for (unsigned int round_trip = 0; round_trip < round_trips; round_trip++) {
            unsigned int previous_count = histogram.count();
            sampler.perform_round_trip();
            unsigned int round_trip_time = histogram.count() - previous_count;

            // update formula: https://en.wikipedia.org/wiki/Algorithms_for_calculating_variance#Online_algorithm
            int n = round_trip + 1;
            double delta = round_trip_time - mean_round_trip;
            mean_round_trip += delta/n;
            std_round_trip += delta*(round_trip_time - mean_round_trip);
        }
        sampler.wang_landau_step();

        sampler.export_entropy(format("wl_B%d_S%d.dat", blocks, round_trips));
        histogram.export_histogram(format("results/histogram_wl_B%d_S%d.dat", blocks, round_trips));
    }
    return 0;
}